

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

uchar * extra_get_record(isoent *isoent,int *space,int *off,int *loc)

{
  isoent *isoent_00;
  int *in_RCX;
  int *in_RDX;
  uint *in_RSI;
  long in_RDI;
  extr_rec *rec;
  extr_rec *local_30;
  
  isoent_00 = *(isoent **)(in_RDI + 0x20);
  if (in_RDX == (int *)0x0) {
    local_30 = extra_last_record(isoent_00);
    if ((local_30 == (extr_rec *)0x0) || (0x800 - local_30->offset < 0x1c)) {
      local_30 = (extr_rec *)malloc(0x810);
      if (local_30 == (extr_rec *)0x0) {
        return (uchar *)0x0;
      }
      local_30->location = 0;
      local_30->offset = 0;
      local_30->next = (extr_rec *)0x0;
      *(isoent_00->extr_rec_list).last = local_30;
      (isoent_00->extr_rec_list).last = &local_30->next;
    }
  }
  else {
    local_30 = (isoent_00->extr_rec_list).current;
    if (0x800 - local_30->offset < 0x1c) {
      local_30 = local_30->next;
    }
  }
  *in_RSI = 0x7e4 - local_30->offset;
  if ((*in_RSI & 1) != 0) {
    *in_RSI = *in_RSI - 1;
  }
  if (in_RDX != (int *)0x0) {
    *in_RDX = local_30->offset;
  }
  if (in_RCX != (int *)0x0) {
    *in_RCX = local_30->location;
  }
  (isoent_00->extr_rec_list).current = local_30;
  return local_30->buf + local_30->offset;
}

Assistant:

static unsigned char *
extra_get_record(struct isoent *isoent, int *space, int *off, int *loc)
{
	struct extr_rec *rec;

	isoent = isoent->parent;
	if (off != NULL) {
		/* Storing data into an extra record. */
		rec = isoent->extr_rec_list.current;
		if (DR_SAFETY > LOGICAL_BLOCK_SIZE - rec->offset)
			rec = rec->next;
	} else {
		/* Calculating the size of an extra record. */
		rec = extra_last_record(isoent);
		if (rec == NULL ||
		    DR_SAFETY > LOGICAL_BLOCK_SIZE - rec->offset) {
			rec = malloc(sizeof(*rec));
			if (rec == NULL)
				return (NULL);
			rec->location = 0;
			rec->offset = 0;
			/* Insert `rec` into the tail of isoent->extr_rec_list */
			rec->next = NULL;
			*isoent->extr_rec_list.last = rec;
			isoent->extr_rec_list.last = &(rec->next);
		}
	}
	*space = LOGICAL_BLOCK_SIZE - rec->offset - DR_SAFETY;
	if (*space & 0x01)
		*space -= 1;/* Keep padding space. */
	if (off != NULL)
		*off = rec->offset;
	if (loc != NULL)
		*loc = rec->location;
	isoent->extr_rec_list.current = rec;

	return (&rec->buf[rec->offset]);
}